

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

CURLcode file_do(Curl_easy *data,_Bool *done)

{
  FILEPROTO *pFVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  CURLcode CVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  __off64_t _Var10;
  size_t len;
  size_t sVar11;
  long lVar12;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  curl_off_t __offset;
  long lVar17;
  char *pcVar18;
  bool bVar19;
  curltime cVar20;
  tm buffer;
  char accept_ranges [24];
  char header [80];
  stat statbuf;
  
  pcVar13 = (data->state).buffer;
  *done = true;
  Curl_pgrsStartNow(data);
  pFVar1 = (data->req).p.file;
  if (((data->set).field_0x9a3 & 0x20) == 0) {
    iVar7 = pFVar1->fd;
    iVar4 = fstat64(iVar7,(stat64 *)&statbuf);
    if (iVar4 == -1) {
      lVar16 = -1;
    }
    else {
      lVar16 = statbuf.st_size;
      if ((statbuf.st_mode & 0xf000) == 0x4000) {
        lVar16 = -1;
      }
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != CURL_TIMECOND_NONE)
          ) && (_Var3 = Curl_meets_timecondition(data,statbuf.st_mtim.tv_sec), !_Var3)) {
        *done = true;
        return CURLE_OK;
      }
      builtin_strncpy(accept_ranges,"Accept-ranges: bytes\r\n",0x17);
      accept_ranges[0x17] = '\0';
      if (-1 < lVar16) {
        iVar5 = curl_msnprintf(header,0x50,"Content-Length: %ld\r\n",lVar16);
        CVar6 = Curl_client_write(data,2,header,(long)iVar5);
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
        sVar9 = strlen(accept_ranges);
        CVar6 = Curl_client_write(data,2,accept_ranges,sVar9);
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
      }
      CVar6 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      iVar5 = 6;
      if (buffer.tm_wday != 0) {
        iVar5 = buffer.tm_wday + -1;
      }
      pcVar18 = "";
      if ((*(uint *)&(data->set).field_0x9a0 >> 0x1c & 1) == 0) {
        pcVar18 = "\r\n";
      }
      iVar5 = curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
                             Curl_wkday[iVar5],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon]
                             ,(ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                             (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec,pcVar18);
      CVar6 = Curl_client_write(data,2,header,(long)iVar5);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      Curl_pgrsSetDownloadSize(data,lVar16);
      if ((*(uint *)&(data->set).field_0x9a0 >> 0x1c & 1) != 0) {
        return CURLE_OK;
      }
    }
    CVar6 = Curl_range(data);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    __offset = (data->state).resume_from;
    if (__offset < 0) {
      if (iVar4 == -1) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      __offset = __offset + statbuf.st_size;
      (data->state).resume_from = __offset;
    }
    lVar17 = lVar16;
    if ((__offset < 1) || (lVar17 = lVar16 - __offset, __offset <= lVar16)) {
      bVar19 = iVar4 != -1;
      lVar16 = (data->req).maxdownload;
      if (0 < lVar16) {
        lVar17 = lVar16;
      }
      bVar2 = 0 < lVar17;
      if (bVar2 && bVar19) {
        Curl_pgrsSetDownloadSize(data,lVar17);
        __offset = (data->state).resume_from;
      }
      if ((__offset == 0) || (_Var10 = lseek64(iVar7,__offset,0), __offset == _Var10)) {
        Curl_pgrsTime(data,TIMER_STARTTRANSFER);
        lVar16 = 0;
        CVar6 = CURLE_OK;
        while (CVar6 == CURLE_OK) {
          sVar9 = (data->set).buffer_size;
          if (bVar2 && bVar19) {
            if (lVar17 < (long)sVar9) {
              sVar9 = curlx_sotouz(lVar17);
            }
          }
          else {
            sVar9 = sVar9 - 1;
          }
          len = read(iVar7,pcVar13,sVar9);
          if (0 < (long)len) {
            pcVar13[len] = '\0';
          }
          if (((long)len < 1) || (lVar17 == 0 && (bVar2 && bVar19))) break;
          sVar14 = 0;
          if (bVar2 && bVar19) {
            sVar14 = len;
          }
          CVar6 = Curl_client_write(data,1,pcVar13,len);
          if (CVar6 != CURLE_OK) {
            return CVar6;
          }
          lVar16 = lVar16 + len;
          lVar17 = lVar17 - sVar14;
          Curl_pgrsSetDownloadCounter(data,lVar16);
          iVar4 = Curl_pgrsUpdate(data);
          CVar6 = CURLE_ABORTED_BY_CALLBACK;
          if (iVar4 == 0) {
            cVar20 = Curl_now();
            CVar6 = Curl_speedcheck(data,cVar20);
          }
        }
        iVar7 = Curl_pgrsUpdate(data);
        if (iVar7 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
        return CVar6;
      }
    }
    else {
      Curl_failf(data,"failed to resume file:// transfer");
    }
    return CURLE_BAD_DOWNLOAD_RESUME;
  }
  pcVar13 = pFVar1->path;
  pcVar8 = strchr(pcVar13,0x2f);
  pcVar18 = (data->state).buffer;
  (data->req).upload_fromhere = pcVar18;
  if (pcVar8 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar8[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar7 = open64(pcVar13,(uint)((data->state).resume_from != 0) * 0x200 + 0x241,
                 (data->set).new_file_perms);
  if (iVar7 < 0) {
    pcVar13 = pFVar1->path;
    pcVar18 = "Can\'t open %s for writing";
LAB_001175b0:
    Curl_failf(data,pcVar18,pcVar13);
    CVar6 = CURLE_WRITE_ERROR;
  }
  else {
    lVar16 = (data->state).infilesize;
    if (lVar16 != -1) {
      Curl_pgrsSetUploadSize(data,lVar16);
    }
    if ((data->state).resume_from < 0) {
      iVar4 = fstat64(iVar7,(stat64 *)&statbuf);
      if (iVar4 != 0) {
        close(iVar7);
        pcVar13 = pFVar1->path;
        pcVar18 = "Can\'t get the size of %s";
        goto LAB_001175b0;
      }
      (data->state).resume_from = statbuf.st_size;
    }
    lVar16 = 0;
    CVar6 = CURLE_OK;
    while( true ) {
      if ((CVar6 != CURLE_OK) ||
         (CVar6 = Curl_fillreadbuffer(data,(data->set).buffer_size,(size_t *)header),
         CVar6 != CURLE_OK)) goto LAB_00117712;
      if (header._0_8_ == 0) break;
      lVar17 = (data->state).resume_from;
      pcVar13 = pcVar18;
      sVar9 = header._0_8_;
      if (lVar17 != 0) {
        sVar11 = header._0_8_ - lVar17;
        lVar15 = 0;
        if (sVar11 != 0 && lVar17 <= (long)header._0_8_) {
          lVar15 = lVar17;
        }
        sVar9 = 0;
        if (sVar11 != 0 && lVar17 <= (long)header._0_8_) {
          sVar9 = sVar11;
        }
        lVar12 = -sVar11;
        if (lVar17 < (long)header._0_8_) {
          lVar12 = 0;
        }
        (data->state).resume_from = lVar12;
        pcVar13 = pcVar18 + lVar15;
      }
      sVar11 = write(iVar7,pcVar13,sVar9);
      if (sVar11 != sVar9) {
        CVar6 = CURLE_SEND_ERROR;
        goto LAB_00117712;
      }
      lVar16 = lVar16 + sVar9;
      Curl_pgrsSetUploadCounter(data,lVar16);
      iVar4 = Curl_pgrsUpdate(data);
      CVar6 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar4 == 0) {
        cVar20 = Curl_now();
        CVar6 = Curl_speedcheck(data,cVar20);
      }
    }
    iVar4 = Curl_pgrsUpdate(data);
    CVar6 = CURLE_ABORTED_BY_CALLBACK;
    if (iVar4 == 0) {
      CVar6 = CURLE_OK;
    }
LAB_00117712:
    close(iVar7);
  }
  return CVar6;
}

Assistant:

static CURLcode file_do(struct Curl_easy *data, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = -1;
  bool size_known;
  bool fstated = FALSE;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(data);

  file = data->req.p.file;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    if(!S_ISDIR(statbuf.st_mode))
      expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  if(fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    int headerlen;
    char accept_ranges[24]= { "Accept-ranges: bytes\r\n" };
    if(expected_size >= 0) {
      headerlen = msnprintf(header, sizeof(header),
                "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n",
                expected_size);
      result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
      if(result)
        return result;

      result = Curl_client_write(data, CLIENTWRITE_HEADER,
                                 accept_ranges, strlen(accept_ranges));
      if(result != CURLE_OK)
        return result;
    }

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    headerlen = msnprintf(header, sizeof(header),
              "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
              Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
              tm->tm_mday,
              Curl_month[tm->tm_mon],
              tm->tm_year + 1900,
              tm->tm_hour,
              tm->tm_min,
              tm->tm_sec,
              data->set.opt_no_body ? "": "\r\n");
    result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
    if(result)
      return result;
    /* set the file size to make it available post transfer */
    Curl_pgrsSetDownloadSize(data, expected_size);
    if(data->set.opt_no_body)
      return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(data);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream if the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from > 0) {
    /* We check explicitly if we have a start offset, because
     * expected_size may be -1 if we don't know how large the file is,
     * in which case we should not adjust it. */
    if(data->state.resume_from <= expected_size)
      expected_size -= data->state.resume_from;
    else {
      failf(data, "failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size <= 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(size_known)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    ssize_t nread;
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(data, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}